

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindReservoirQuantileDecimalList
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  long in_RDX;
  AggregateFunction *in_RDI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000138;
  AggregateFunction *in_stack_00000140;
  ClientContext *in_stack_00000148;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *bind_data;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  LogicalType *in_stack_ffffffffffffff28;
  
  this._M_head_impl = (FunctionData *)in_RDI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_RDI,(size_type)in_RDI);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             this._M_head_impl);
  GetReservoirQuantileListAggregateFunction(in_stack_ffffffffffffff28);
  AggregateFunction::operator=((AggregateFunction *)this._M_head_impl,in_RDI);
  AggregateFunction::~AggregateFunction((AggregateFunction *)this._M_head_impl);
  BindReservoirQuantile(in_stack_00000148,in_stack_00000140,in_stack_00000138);
  *(code **)(in_RDX + 0x108) = ReservoirQuantileBindData::Serialize;
  *(code **)(in_RDX + 0x110) = ReservoirQuantileBindData::Deserialize;
  std::__cxx11::string::operator=((string *)(in_RDX + 8),"reservoir_quantile");
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindReservoirQuantileDecimalList(ClientContext &context, AggregateFunction &function,
                                                          vector<unique_ptr<Expression>> &arguments) {
	function = GetReservoirQuantileListAggregateFunction(arguments[0]->return_type);
	auto bind_data = BindReservoirQuantile(context, function, arguments);
	function.serialize = ReservoirQuantileBindData::Serialize;
	function.deserialize = ReservoirQuantileBindData::Deserialize;
	function.name = "reservoir_quantile";
	return bind_data;
}